

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  local_28.pointer = (this->_builder).pointers + 3;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  ::capnp::_::PointerBuilder::getList
            (&__return_storage_ptr__->builder,&local_28,VOID,(word *)&DAT_0047da20);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::Void,  ::capnp::Kind::PRIMITIVE>::Builder TestDefaults::Builder::getVoidList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::Void,  ::capnp::Kind::PRIMITIVE>>::get(_builder.getPointerField(
      ::capnp::bounded<3>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 631);
}